

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::SliceLayerParams::ByteSizeLong(SliceLayerParams *this)

{
  SliceLayerParams_SliceAxis SVar1;
  int iVar2;
  int64 iVar3;
  size_t sVar4;
  uint64 uVar5;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  SliceLayerParams *this_local;
  
  sStack_18 = 0;
  iVar3 = startindex(this);
  if (iVar3 != 0) {
    iVar3 = startindex(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::Int64Size(iVar3);
    sStack_18 = sStack_18 + 1;
  }
  iVar3 = endindex(this);
  if (iVar3 != 0) {
    iVar3 = endindex(this);
    sVar4 = google::protobuf::internal::WireFormatLite::Int64Size(iVar3);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  uVar5 = stride(this);
  if (uVar5 != 0) {
    uVar5 = stride(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar5);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  SVar1 = axis(this);
  if (SVar1 != SliceLayerParams_SliceAxis_CHANNEL_AXIS) {
    SVar1 = axis(this);
    sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(SVar1);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t SliceLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SliceLayerParams)
  size_t total_size = 0;

  // int64 startIndex = 1;
  if (this->startindex() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->startindex());
  }

  // int64 endIndex = 2;
  if (this->endindex() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->endindex());
  }

  // uint64 stride = 3;
  if (this->stride() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->stride());
  }

  // .CoreML.Specification.SliceLayerParams.SliceAxis axis = 4;
  if (this->axis() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->axis());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}